

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

int xmlRegExecPushString2(xmlRegExecCtxtPtr exec,xmlChar *value,xmlChar *value2,void *data)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  xmlChar *value_00;
  int iVar4;
  xmlChar buf [150];
  
  if ((exec == (xmlRegExecCtxtPtr)0x0) || (exec->comp == (xmlRegexpPtr)0x0)) {
LAB_001a01ca:
    iVar1 = -1;
  }
  else {
    if (exec->status != 0) {
      return exec->status;
    }
    if (value2 == (xmlChar *)0x0) {
      iVar1 = xmlRegExecPushString(exec,value,data);
      return iVar1;
    }
    sVar2 = strlen((char *)value2);
    sVar3 = strlen((char *)value);
    iVar1 = (int)sVar3;
    iVar4 = (int)sVar2 + iVar1;
    if (iVar4 < 0x95) {
      value_00 = buf;
    }
    else {
      value_00 = (xmlChar *)(*xmlMallocAtomic)((long)iVar4 + 2);
      if (value_00 == (xmlChar *)0x0) {
        exec->status = -1;
        goto LAB_001a01ca;
      }
    }
    memcpy(value_00,value,(long)iVar1);
    value_00[iVar1] = '|';
    memcpy(value_00 + (iVar1 + 1),value2,(long)(int)sVar2);
    value_00[(long)iVar4 + 1] = '\0';
    if (exec->comp->compact == (int *)0x0) {
      iVar1 = xmlRegExecPushStringInternal(exec,value_00,data,1);
    }
    else {
      iVar1 = xmlRegCompactPushString(exec,exec->comp,value_00,data);
    }
    if (value_00 != buf) {
      (*xmlFree)(value_00);
    }
  }
  return iVar1;
}

Assistant:

int
xmlRegExecPushString2(xmlRegExecCtxtPtr exec, const xmlChar *value,
                      const xmlChar *value2, void *data) {
    xmlChar buf[150];
    int lenn, lenp, ret;
    xmlChar *str;

    if (exec == NULL)
	return(-1);
    if (exec->comp == NULL)
	return(-1);
    if (exec->status != 0)
	return(exec->status);

    if (value2 == NULL)
        return(xmlRegExecPushString(exec, value, data));

    lenn = strlen((char *) value2);
    lenp = strlen((char *) value);

    if (150 < lenn + lenp + 2) {
	str = (xmlChar *) xmlMallocAtomic(lenn + lenp + 2);
	if (str == NULL) {
	    exec->status = -1;
	    return(-1);
	}
    } else {
	str = buf;
    }
    memcpy(&str[0], value, lenp);
    str[lenp] = XML_REG_STRING_SEPARATOR;
    memcpy(&str[lenp + 1], value2, lenn);
    str[lenn + lenp + 1] = 0;

    if (exec->comp->compact != NULL)
	ret = xmlRegCompactPushString(exec, exec->comp, str, data);
    else
        ret = xmlRegExecPushStringInternal(exec, str, data, 1);

    if (str != buf)
        xmlFree(str);
    return(ret);
}